

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint filter(uchar *out,uchar *in,uint w,uint h,LodePNGColorMode *info,
           LodePNGEncoderSettings *settings)

{
  int *piVar1;
  float fVar2;
  uchar filterType;
  byte bVar3;
  LodePNGColorType LVar4;
  undefined4 uVar5;
  size_t sVar6;
  uint uVar7;
  uchar *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ucvector *puVar17;
  uchar *puVar18;
  LodePNGFilterStrategy LVar19;
  uchar *puVar20;
  float *pfVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  size_t *psVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uchar *dummy;
  size_t size [5];
  ucvector attempt_1 [5];
  ucvector attempt [5];
  ulong local_548;
  uchar *local_540;
  ulong local_538;
  uchar *local_4f8;
  ulong local_4f0;
  float local_4e8 [2];
  ulong auStack_4e0 [5];
  LodePNGCompressSettings local_4b8 [2];
  ulong auStack_448 [2];
  ucvector local_438 [43];
  ulong length;
  
  LVar4 = info->colortype;
  iVar23 = 0;
  if ((ulong)LVar4 < 7) {
    iVar23 = *(int *)(&DAT_00239000 + (ulong)LVar4 * 4);
  }
  iVar23 = iVar23 * info->bitdepth;
  if (iVar23 == 0) {
    return 0x1f;
  }
  LVar19 = settings->filter_strategy;
  if (info->bitdepth < 8) {
    LVar19 = LFS_ZERO;
  }
  if (LVar4 == LCT_PALETTE) {
    LVar19 = LFS_ZERO;
  }
  if (settings->filter_palette_zero == 0) {
    LVar19 = settings->filter_strategy;
  }
  if (LFS_PREDEFINED < LVar19) {
    return 0x58;
  }
  uVar12 = w * iVar23 + 7;
  uVar26 = uVar12 >> 3;
  length = (ulong)uVar26;
  uVar16 = (ulong)(iVar23 + 7U >> 3);
  switch(LVar19) {
  case LFS_ZERO:
    if (h != 0) {
      puVar18 = out + 1;
      uVar16 = 0;
      do {
        out[(length + 1) * uVar16] = '\0';
        if (7 < uVar12) {
          uVar13 = 0;
          do {
            puVar18[uVar13] = in[uVar13];
            uVar13 = uVar13 + 1;
          } while (length != uVar13);
        }
        uVar16 = uVar16 + 1;
        puVar18 = puVar18 + length + 1;
        in = in + length;
      } while (uVar16 != h);
    }
    break;
  case LFS_MINSUM:
    local_438[0].data = (uchar *)0x0;
    local_438[0].size = 0;
    local_438[0].allocsize = 0;
    uVar7 = ucvector_reserve(local_438,length);
    if (uVar7 == 0) {
      return 0x53;
    }
    lVar24 = 0x18;
    do {
      *(ulong *)((long)auStack_448 + lVar24) = length;
      lVar10 = lVar24 + 0x18;
      if (lVar10 == 0x90) {
        if (h != 0) {
          puVar18 = out + 1;
          uVar14 = 0;
          local_548 = 0;
          uVar13 = 0;
          puVar20 = (uchar *)0x0;
          do {
            lVar24 = uVar14 * length;
            uVar15 = 0;
            do {
              puVar8 = local_438[uVar15].data;
              filterScanline(puVar8,in + lVar24,puVar20,length,uVar16,(uchar)uVar15);
              *(undefined8 *)(&local_4b8[0].btype + uVar15 * 2) = 0;
              if (uVar15 == 0) {
                if (7 < uVar12) {
                  lVar9 = 0;
                  lVar22 = local_4b8[0]._0_8_;
                  do {
                    lVar22 = lVar22 + (ulong)puVar8[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (uVar26 != (uint)lVar9);
                  goto LAB_001b087b;
                }
              }
              else if (7 < uVar12) {
                lVar22 = *(long *)(&local_4b8[0].btype + uVar15 * 2);
                lVar9 = 0;
                do {
                  bVar3 = puVar8[lVar9];
                  uVar7 = bVar3 ^ 0xff;
                  if (-1 < (char)bVar3) {
                    uVar7 = (uint)bVar3;
                  }
                  lVar22 = lVar22 + (ulong)uVar7;
                  lVar9 = lVar9 + 1;
                } while (uVar26 != (uint)lVar9);
LAB_001b087b:
                *(long *)(&local_4b8[0].btype + uVar15 * 2) = lVar22;
              }
              if ((uVar15 == 0) || (*(ulong *)(&local_4b8[0].btype + uVar15 * 2) < uVar13)) {
                uVar13 = *(ulong *)(&local_4b8[0].btype + uVar15 * 2);
                local_548 = uVar15 & 0xffffffff;
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != 5);
            out[(length + 1) * uVar14] = (uchar)local_548;
            if (7 < uVar12) {
              puVar20 = local_438[local_548 & 0xff].data;
              lVar22 = 0;
              do {
                puVar18[lVar22] = puVar20[lVar22];
                lVar22 = lVar22 + 1;
              } while (uVar26 != (uint)lVar22);
            }
            uVar14 = uVar14 + 1;
            puVar18 = puVar18 + length + 1;
            puVar20 = in + lVar24;
          } while (uVar14 != h);
        }
        lVar24 = 0;
        do {
          *(undefined8 *)((long)&local_438[0].size + lVar24) = 0;
          *(undefined8 *)((long)&local_438[0].allocsize + lVar24) = 0;
          free(*(void **)((long)&local_438[0].data + lVar24));
          *(undefined8 *)((long)&local_438[0].data + lVar24) = 0;
          lVar24 = lVar24 + 0x18;
        } while (lVar24 != 0x78);
        break;
      }
      puVar17 = (ucvector *)((long)&local_438[0].data + lVar24);
      puVar17->data = (uchar *)0x0;
      *(undefined8 *)((long)&local_438[0].size + lVar24) = 0;
      *(undefined8 *)((long)&local_438[0].allocsize + lVar24) = 0;
      uVar7 = ucvector_reserve(puVar17,length);
      lVar24 = lVar10;
    } while (uVar7 != 0);
    goto LAB_001b0944;
  case LFS_ENTROPY:
    local_4b8[0].btype = 0;
    local_4b8[0].use_lz77 = 0;
    local_4b8[0].windowsize = 0;
    local_4b8[0].minmatch = 0;
    local_4b8[0].nicematch = 0;
    local_4b8[0].lazymatching = 0;
    uVar7 = ucvector_reserve((ucvector *)local_4b8,length);
    if (uVar7 == 0) {
      return 0x53;
    }
    lVar24 = 0x18;
    do {
      *(ulong *)((long)auStack_4e0 + lVar24 + 0x18) = length;
      lVar10 = lVar24 + 0x18;
      if (lVar10 == 0x90) {
        if (h != 0) {
          lVar24 = length + 1;
          puVar18 = out + 1;
          fVar2 = 0.0;
          uVar13 = 0;
          local_540 = (uchar *)0x0;
          puVar20 = (uchar *)0x0;
          do {
            lVar22 = uVar13 * length;
            uVar14 = 0;
            do {
              puVar8 = *(uchar **)(&local_4b8[0].btype + uVar14 * 6);
              filterScanline(puVar8,in + lVar22,puVar20,length,uVar16,(uchar)uVar14);
              memset(local_438,0,0x400);
              if (7 < uVar12) {
                lVar9 = 0;
                do {
                  piVar1 = (int *)((long)&local_438[0].data + (ulong)puVar8[lVar9] * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar9 = lVar9 + 1;
                } while (uVar26 != (uint)lVar9);
              }
              piVar1 = (int *)((long)&local_438[0].data + uVar14 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)((long)auStack_4e0 + uVar14 * 4 + -8) = 0;
              fVar27 = 0.0;
              lVar9 = 0;
              do {
                uVar7 = *(uint *)((long)&local_438[0].data + lVar9 * 4);
                fVar28 = 0.0;
                if (uVar7 != 0) {
                  fVar28 = (float)uVar7 / (float)(int)lVar24;
                  fVar30 = 0.0;
                  for (fVar29 = 1.0 / fVar28; 32.0 < fVar29; fVar29 = fVar29 * 0.0625) {
                    fVar30 = fVar30 + 4.0;
                  }
                  for (; 2.0 < fVar29; fVar29 = fVar29 * 0.5) {
                    fVar30 = fVar30 + 1.0;
                  }
                  fVar28 = fVar28 * ((fVar29 * fVar29 * 3.0 * -0.5 +
                                      (fVar29 * fVar29 * fVar29) / 3.0 + fVar29 * 3.0 + -1.83333) *
                                     1.442695 + fVar30);
                }
                fVar27 = fVar27 + fVar28;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 0x100);
              *(float *)((long)auStack_4e0 + uVar14 * 4 + -8) = fVar27;
              if ((uVar14 == 0) ||
                 (pfVar21 = (float *)((long)auStack_4e0 + uVar14 * 4 + -8),
                 *pfVar21 <= fVar2 && fVar2 != *pfVar21)) {
                fVar2 = *(float *)((long)auStack_4e0 + uVar14 * 4 + -8);
                local_540 = (uchar *)(uVar14 & 0xffffffff);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != 5);
            out[lVar24 * uVar13] = (uchar)local_540;
            if (7 < uVar12) {
              lVar9 = *(long *)(&local_4b8[0].btype + (long)local_540 * 6);
              lVar11 = 0;
              do {
                puVar18[lVar11] = *(uchar *)(lVar9 + lVar11);
                lVar11 = lVar11 + 1;
              } while (uVar26 != (uint)lVar11);
            }
            uVar13 = uVar13 + 1;
            puVar18 = puVar18 + lVar24;
            puVar20 = in + lVar22;
          } while (uVar13 != h);
        }
        lVar24 = 0;
        do {
          *(undefined8 *)((long)&local_4b8[0].windowsize + lVar24) = 0;
          *(undefined8 *)((long)&local_4b8[0].nicematch + lVar24) = 0;
          free(*(void **)((long)&local_4b8[0].btype + lVar24));
          *(undefined8 *)((long)&local_4b8[0].btype + lVar24) = 0;
          lVar24 = lVar24 + 0x18;
        } while (lVar24 != 0x78);
        break;
      }
      puVar17 = (ucvector *)((long)&local_4b8[0].btype + lVar24);
      puVar17->data = (uchar *)0x0;
      *(undefined8 *)((long)&local_4b8[0].windowsize + lVar24) = 0;
      *(undefined8 *)((long)&local_4b8[0].nicematch + lVar24) = 0;
      uVar7 = ucvector_reserve(puVar17,length);
      lVar24 = lVar10;
    } while (uVar7 != 0);
LAB_001b0944:
    if (lVar10 == 0x90) {
      return 0;
    }
    return 0x53;
  case LFS_BRUTE_FORCE:
    uVar5 = (settings->zlibsettings).use_lz77;
    local_4b8[0].windowsize = (settings->zlibsettings).windowsize;
    local_4b8[0].minmatch = (settings->zlibsettings).minmatch;
    local_4b8[0].nicematch = (settings->zlibsettings).nicematch;
    local_4b8[0].lazymatching = (settings->zlibsettings).lazymatching;
    local_4b8[0].custom_context = (settings->zlibsettings).custom_context;
    local_4b8[0].use_lz77 = uVar5;
    local_4b8[0].btype = 1;
    local_4b8[0].custom_zlib =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    local_4b8[0].custom_deflate =
         (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)0x0;
    lVar24 = 0;
    do {
      puVar17 = (ucvector *)((long)&local_438[0].data + lVar24);
      puVar17->data = (uchar *)0x0;
      *(undefined8 *)((long)&local_438[0].size + lVar24) = 0;
      *(undefined8 *)((long)&local_438[0].allocsize + lVar24) = 0;
      uVar7 = ucvector_reserve(puVar17,length);
      if (uVar7 != 0) {
        *(ulong *)((long)&local_438[0].size + lVar24) = length;
      }
      lVar24 = lVar24 + 0x18;
    } while (lVar24 != 0x78);
    if (h != 0) {
      puVar18 = out + 1;
      uVar13 = 0;
      local_538 = 0;
      local_548 = 0;
      local_540 = (uchar *)0x0;
      local_4f0 = (ulong)h;
      do {
        lVar24 = uVar13 * length;
        pfVar21 = local_4e8;
        psVar25 = &local_438[0].size;
        uVar14 = 0;
        do {
          sVar6 = *psVar25;
          puVar20 = ((ucvector *)(psVar25 + -1))->data;
          filterScanline(puVar20,in + lVar24,local_540,length,uVar16,(uchar)uVar14);
          auStack_4e0[uVar14 - 1] = 0;
          local_4f8 = (uchar *)0x0;
          if (local_4b8[0].custom_zlib ==
              (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)
              0x0) {
            lodepng_zlib_compress(&local_4f8,(size_t *)pfVar21,puVar20,(ulong)(uint)sVar6,local_4b8)
            ;
          }
          else {
            (*local_4b8[0].custom_zlib)
                      (&local_4f8,(size_t *)pfVar21,puVar20,(ulong)(uint)sVar6,local_4b8);
          }
          free(local_4f8);
          if ((uVar14 == 0) || (auStack_4e0[uVar14 - 1] < local_548)) {
            local_548 = auStack_4e0[uVar14 - 1];
            local_538 = uVar14 & 0xffffffff;
          }
          uVar14 = uVar14 + 1;
          psVar25 = psVar25 + 3;
          pfVar21 = pfVar21 + 2;
        } while (uVar14 != 5);
        out[(length + 1) * uVar13] = (uchar)local_538;
        if (7 < uVar12) {
          puVar20 = local_438[local_538].data;
          lVar10 = 0;
          do {
            puVar18[lVar10] = puVar20[lVar10];
            lVar10 = lVar10 + 1;
          } while (uVar26 != (uint)lVar10);
        }
        uVar13 = uVar13 + 1;
        puVar18 = puVar18 + length + 1;
        local_540 = in + lVar24;
      } while (uVar13 != local_4f0);
    }
    lVar24 = 0;
    do {
      *(undefined8 *)((long)&local_438[0].size + lVar24) = 0;
      *(undefined8 *)((long)&local_438[0].allocsize + lVar24) = 0;
      free(*(void **)((long)&local_438[0].data + lVar24));
      *(undefined8 *)((long)&local_438[0].data + lVar24) = 0;
      lVar24 = lVar24 + 0x18;
    } while (lVar24 != 0x78);
    break;
  case LFS_PREDEFINED:
    if (h != 0) {
      puVar20 = out + 1;
      uVar13 = 0;
      puVar18 = (uchar *)0x0;
      do {
        puVar8 = in;
        filterType = settings->predefined_filters[uVar13];
        puVar20[-1] = filterType;
        filterScanline(puVar20,puVar8,puVar18,length,uVar16,filterType);
        uVar13 = uVar13 + 1;
        puVar20 = puVar20 + length + 1;
        in = puVar8 + length;
        puVar18 = puVar8;
      } while (h != uVar13);
    }
  }
  return 0;
}

Assistant:

static unsigned filter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h,
                       const LodePNGColorMode* info, const LodePNGEncoderSettings* settings)
{
  /*
  For PNG filter method 0
  out must be a buffer with as size: h + (w * h * bpp + 7) / 8, because there are
  the scanlines with 1 extra byte per scanline
  */

  unsigned bpp = lodepng_get_bpp(info);
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = (w * bpp + 7) / 8;
  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7) / 8;
  const unsigned char* prevline = 0;
  unsigned x, y;
  unsigned error = 0;
  LodePNGFilterStrategy strategy = settings->filter_strategy;

  /*
  There is a heuristic called the minimum sum of absolute differences heuristic, suggested by the PNG standard:
   *  If the image type is Palette, or the bit depth is smaller than 8, then do not filter the image (i.e.
      use fixed filtering, with the filter None).
   * (The other case) If the image type is Grayscale or RGB (with or without Alpha), and the bit depth is
     not smaller than 8, then use adaptive filtering heuristic as follows: independently for each row, apply
     all five filters and select the filter that produces the smallest sum of absolute values per row.
  This heuristic is used if filter strategy is LFS_MINSUM and filter_palette_zero is true.

  If filter_palette_zero is true and filter_strategy is not LFS_MINSUM, the above heuristic is followed,
  but for "the other case", whatever strategy filter_strategy is set to instead of the minimum sum
  heuristic is used.
  */
  if(settings->filter_palette_zero &&
     (info->colortype == LCT_PALETTE || info->bitdepth < 8)) strategy = LFS_ZERO;

  if(bpp == 0) return 31; /*error: invalid color type*/

  if(strategy == LFS_ZERO)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      out[outindex] = 0; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, 0);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_MINSUM)
  {
    /*adaptive filtering*/
    size_t sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned char type, bestType = 0;

    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    if(!error)
    {
      for(y = 0; y != h; ++y)
      {
        /*try the 5 filter types*/
        for(type = 0; type != 5; ++type)
        {
          filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);

          /*calculate the sum of the result*/
          sum[type] = 0;
          if(type == 0)
          {
            for(x = 0; x != linebytes; ++x) sum[type] += (unsigned char)(attempt[type].data[x]);
          }
          else
          {
            for(x = 0; x != linebytes; ++x)
            {
              /*For differences, each byte should be treated as signed, values above 127 are negative
              (converted to signed char). Filtertype 0 isn't a difference though, so use unsigned there.
              This means filtertype 0 is almost never chosen, but that is justified.*/
              unsigned char s = attempt[type].data[x];
              sum[type] += s < 128 ? s : (255U - s);
            }
          }

          /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
          if(type == 0 || sum[type] < smallest)
          {
            bestType = type;
            smallest = sum[type];
          }
        }

        prevline = &in[y * linebytes];

        /*now fill the out values*/
        out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
        for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
      }
    }

    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_ENTROPY)
  {
    float sum[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    float smallest = 0;
    unsigned type, bestType = 0;
    unsigned count[256];

    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      if(!ucvector_resize(&attempt[type], linebytes)) return 83; /*alloc fail*/
    }

    for(y = 0; y != h; ++y)
    {
      /*try the 5 filter types*/
      for(type = 0; type != 5; ++type)
      {
        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        for(x = 0; x != 256; ++x) count[x] = 0;
        for(x = 0; x != linebytes; ++x) ++count[attempt[type].data[x]];
        ++count[type]; /*the filter type itself is part of the scanline*/
        sum[type] = 0;
        for(x = 0; x != 256; ++x)
        {
          float p = count[x] / (float)(linebytes + 1);
          sum[type] += count[x] == 0 ? 0 : flog2(1 / p) * p;
        }
        /*check if this is smallest sum (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || sum[type] < smallest)
        {
          bestType = type;
          smallest = sum[type];
        }
      }

      prevline = &in[y * linebytes];

      /*now fill the out values*/
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }

    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else if(strategy == LFS_PREDEFINED)
  {
    for(y = 0; y != h; ++y)
    {
      size_t outindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
      size_t inindex = linebytes * y;
      unsigned char type = settings->predefined_filters[y];
      out[outindex] = type; /*filter type byte*/
      filterScanline(&out[outindex + 1], &in[inindex], prevline, linebytes, bytewidth, type);
      prevline = &in[inindex];
    }
  }
  else if(strategy == LFS_BRUTE_FORCE)
  {
    /*brute force filter chooser.
    deflate the scanline after every filter attempt to see which one deflates best.
    This is very slow and gives only slightly smaller, sometimes even larger, result*/
    size_t size[5];
    ucvector attempt[5]; /*five filtering attempts, one for each filter type*/
    size_t smallest = 0;
    unsigned type = 0, bestType = 0;
    unsigned char* dummy;
    LodePNGCompressSettings zlibsettings = settings->zlibsettings;
    /*use fixed tree on the attempts so that the tree is not adapted to the filtertype on purpose,
    to simulate the true case where the tree is the same for the whole image. Sometimes it gives
    better result with dynamic tree anyway. Using the fixed tree sometimes gives worse, but in rare
    cases better compression. It does make this a bit less slow, so it's worth doing this.*/
    zlibsettings.btype = 1;
    /*a custom encoder likely doesn't read the btype setting and is optimized for complete PNG
    images only, so disable it*/
    zlibsettings.custom_zlib = 0;
    zlibsettings.custom_deflate = 0;
    for(type = 0; type != 5; ++type)
    {
      ucvector_init(&attempt[type]);
      ucvector_resize(&attempt[type], linebytes); /*todo: give error if resize failed*/
    }
    for(y = 0; y != h; ++y) /*try the 5 filter types*/
    {
      for(type = 0; type != 5; ++type)
      {
        unsigned testsize = attempt[type].size;
        /*if(testsize > 8) testsize /= 8;*/ /*it already works good enough by testing a part of the row*/

        filterScanline(attempt[type].data, &in[y * linebytes], prevline, linebytes, bytewidth, type);
        size[type] = 0;
        dummy = 0;
        zlib_compress(&dummy, &size[type], attempt[type].data, testsize, &zlibsettings);
        lodepng_free(dummy);
        /*check if this is smallest size (or if type == 0 it's the first case so always store the values)*/
        if(type == 0 || size[type] < smallest)
        {
          bestType = type;
          smallest = size[type];
        }
      }
      prevline = &in[y * linebytes];
      out[y * (linebytes + 1)] = bestType; /*the first byte of a scanline will be the filter type*/
      for(x = 0; x != linebytes; ++x) out[y * (linebytes + 1) + 1 + x] = attempt[bestType].data[x];
    }
    for(type = 0; type != 5; ++type) ucvector_cleanup(&attempt[type]);
  }
  else return 88; /* unknown filter strategy */

  return error;
}